

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O2

int sf_sizeof(GlobalVars *gv,lword addr,lword *res)

{
  bool bVar1;
  LinkedSection *pLVar2;
  
  bVar1 = startofblock('(');
  if (bVar1 != 0) {
    pLVar2 = getsection(gv);
    if (pLVar2 != (LinkedSection *)0x0) {
      *res = pLVar2->size;
    }
    endofblock('(',')');
  }
  return 1;
}

Assistant:

static int sf_sizeof(struct GlobalVars *gv,lword addr,lword *res)
{
  struct LinkedSection *ls;

  if (startofblock('(')) {
    if (ls = getsection(gv))
      *res = ls->size;
    endofblock('(',')');
  }
  return 1;
}